

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O3

void xmlXIncludeFreeContext(xmlXIncludeCtxtPtr ctxt)

{
  int iVar1;
  xmlChar **ppxVar2;
  xmlURL *ppxVar3;
  long lVar4;
  
  if (ctxt == (xmlXIncludeCtxtPtr)0x0) {
    return;
  }
  while (0 < ctxt->urlNr) {
    xmlXIncludeURLPop(ctxt);
  }
  if (ctxt->urlTab != (xmlChar **)0x0) {
    (*xmlFree)(ctxt->urlTab);
  }
  iVar1 = ctxt->incNr;
  if (0 < iVar1) {
    lVar4 = 0;
    do {
      if (ctxt->incTab[lVar4] != (xmlXIncludeRefPtr)0x0) {
        xmlXIncludeFreeRef(ctxt->incTab[lVar4]);
        iVar1 = ctxt->incNr;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar1);
  }
  if (ctxt->incTab != (xmlXIncludeRefPtr *)0x0) {
    (*xmlFree)(ctxt->incTab);
  }
  ppxVar2 = ctxt->txtTab;
  if (ppxVar2 != (xmlChar **)0x0) {
    iVar1 = ctxt->txtNr;
    if (0 < iVar1) {
      lVar4 = 0;
      do {
        if (ctxt->txtTab[lVar4] != (xmlChar *)0x0) {
          (*xmlFree)(ctxt->txtTab[lVar4]);
          iVar1 = ctxt->txtNr;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < iVar1);
      ppxVar2 = ctxt->txtTab;
    }
    (*xmlFree)(ppxVar2);
  }
  ppxVar3 = ctxt->txturlTab;
  if (ppxVar3 != (xmlURL *)0x0) {
    iVar1 = ctxt->txtNr;
    if (0 < iVar1) {
      lVar4 = 0;
      do {
        if (ctxt->txturlTab[lVar4] != (xmlURL)0x0) {
          (*xmlFree)(ctxt->txturlTab[lVar4]);
          iVar1 = ctxt->txtNr;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < iVar1);
      ppxVar3 = ctxt->txturlTab;
    }
    (*xmlFree)(ppxVar3);
  }
  if (ctxt->base != (xmlChar *)0x0) {
    (*xmlFree)(ctxt->base);
  }
  (*xmlFree)(ctxt);
  return;
}

Assistant:

void
xmlXIncludeFreeContext(xmlXIncludeCtxtPtr ctxt) {
    int i;

#ifdef DEBUG_XINCLUDE
    xmlGenericError(xmlGenericErrorContext, "Freeing context\n");
#endif
    if (ctxt == NULL)
	return;
    while (ctxt->urlNr > 0)
	xmlXIncludeURLPop(ctxt);
    if (ctxt->urlTab != NULL)
	xmlFree(ctxt->urlTab);
    for (i = 0;i < ctxt->incNr;i++) {
	if (ctxt->incTab[i] != NULL)
	    xmlXIncludeFreeRef(ctxt->incTab[i]);
    }
    if (ctxt->incTab != NULL)
	xmlFree(ctxt->incTab);
    if (ctxt->txtTab != NULL) {
	for (i = 0;i < ctxt->txtNr;i++) {
	    if (ctxt->txtTab[i] != NULL)
		xmlFree(ctxt->txtTab[i]);
	}
	xmlFree(ctxt->txtTab);
    }
    if (ctxt->txturlTab != NULL) {
	for (i = 0;i < ctxt->txtNr;i++) {
	    if (ctxt->txturlTab[i] != NULL)
		xmlFree(ctxt->txturlTab[i]);
	}
	xmlFree(ctxt->txturlTab);
    }
    if (ctxt->base != NULL) {
        xmlFree(ctxt->base);
    }
    xmlFree(ctxt);
}